

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

wchar_t get_global_set_keys(mtree_writer *mtree,mtree_entry_conflict *me)

{
  mode_t mVar1;
  wchar_t local_24;
  wchar_t keys;
  mtree_entry_conflict *me_local;
  mtree_writer *mtree_local;
  
  local_24 = mtree->keys;
  mtree_local._4_4_ = local_24;
  if ((mtree->set).keys != L'\0') {
    if ((((mtree->set).keys & 0x30U) != 0) && ((mtree->set).gid == me->gid)) {
      local_24 = local_24 & 0xffffffcf;
    }
    if ((((mtree->set).keys & 0x300000U) != 0) && ((mtree->set).uid == me->uid)) {
      local_24 = local_24 & 0xffcfffff;
    }
    if (((((mtree->set).keys & 8U) != 0) && ((mtree->set).fflags_set == me->fflags_set)) &&
       ((mtree->set).fflags_clear == me->fflags_clear)) {
      local_24 = local_24 & 0xfffffff7;
    }
    if ((((mtree->set).keys & 0x200U) != 0) && ((mtree->set).mode == me->mode)) {
      local_24 = local_24 & 0xfffffdff;
    }
    mVar1 = me->filetype;
    if ((mVar1 != 0x1000) && (mVar1 != 0x2000)) {
      if (mVar1 == 0x4000) {
        if ((((mtree->set).keys & 0x80000U) != 0) && ((mtree->set).type == 0x4000)) {
          local_24 = local_24 & 0xfff7ffff;
        }
      }
      else if (((mVar1 != 0x6000) &&
               (((mVar1 == 0x8000 || ((mVar1 != 0xa000 && (mVar1 != 0xc000)))) &&
                (((mtree->set).keys & 0x80000U) != 0)))) && ((mtree->set).type == 0x8000)) {
        local_24 = local_24 & 0xfff7ffff;
      }
    }
    mtree_local._4_4_ = local_24;
  }
  return mtree_local._4_4_;
}

Assistant:

static int
get_global_set_keys(struct mtree_writer *mtree, struct mtree_entry *me)
{
	int keys;

	keys = mtree->keys;

	/*
	 * If a keyword has been set by /set, we do not need to
	 * output it.
	 */
	if (mtree->set.keys == 0)
		return (keys);/* /set is not used. */

	if ((mtree->set.keys & (F_GNAME | F_GID)) != 0 &&
	     mtree->set.gid == me->gid)
		keys &= ~(F_GNAME | F_GID);
	if ((mtree->set.keys & (F_UNAME | F_UID)) != 0 &&
	     mtree->set.uid == me->uid)
		keys &= ~(F_UNAME | F_UID);
	if (mtree->set.keys & F_FLAGS) {
		if (mtree->set.fflags_set == me->fflags_set &&
		    mtree->set.fflags_clear == me->fflags_clear)
			keys &= ~F_FLAGS;
	}
	if ((mtree->set.keys & F_MODE) != 0 && mtree->set.mode == me->mode)
		keys &= ~F_MODE;

	switch (me->filetype) {
	case AE_IFLNK: case AE_IFSOCK: case AE_IFCHR:
	case AE_IFBLK: case AE_IFIFO:
		break;
	case AE_IFDIR:
		if ((mtree->set.keys & F_TYPE) != 0 &&
		    mtree->set.type == AE_IFDIR)
			keys &= ~F_TYPE;
		break;
	case AE_IFREG:
	default:	/* Handle unknown file types as regular files. */
		if ((mtree->set.keys & F_TYPE) != 0 &&
		    mtree->set.type == AE_IFREG)
			keys &= ~F_TYPE;
		break;
	}

	return (keys);
}